

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O3

void __thiscall Rml::Context::PullDocumentToFront(Context *this,ElementDocument *document)

{
  long lVar1;
  Element *pEVar2;
  pointer puVar3;
  int iVar4;
  Element *in_RAX;
  ElementDocument *pEVar5;
  pointer *__ptr;
  long lVar6;
  long lVar7;
  _Head_base<0UL,_Rml::Element_*,_false> local_38;
  
  local_38._M_head_impl = in_RAX;
  pEVar5 = (ElementDocument *)
           Element::GetLastChild
                     ((this->root)._M_t.
                      super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                      super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                      super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl);
  if (pEVar5 != document) {
    iVar4 = Element::GetNumChildren
                      ((this->root)._M_t.
                       super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                       super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                       super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,false);
    if (0 < iVar4) {
      lVar6 = 0;
      lVar7 = 0;
      do {
        pEVar5 = (ElementDocument *)
                 Element::GetChild((this->root)._M_t.
                                   super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>
                                   .super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,
                                   (int)lVar7);
        if (pEVar5 == document) {
          lVar1 = *(long *)&(((this->root)._M_t.
                              super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t
                              .super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                              super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl)->children).
                            super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                            ._M_impl;
          local_38._M_head_impl = *(Element **)(lVar1 + lVar7 * 8);
          *(undefined8 *)(lVar1 + lVar7 * 8) = 0;
          pEVar2 = (this->root)._M_t.
                   super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                   super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                   super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
          ::std::
          vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
          ::_M_erase(&pEVar2->children,
                     (unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)
                     (*(long *)&(pEVar2->children).
                                super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                                ._M_impl + lVar6));
          pEVar2 = (this->root)._M_t.
                   super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                   super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                   super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
          puVar3 = (pEVar2->children).
                   super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar4 = Element::GetNumChildren(pEVar2,false);
          ::std::
          vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
          ::_M_insert_rval(&pEVar2->children,puVar3 + iVar4,(value_type *)&local_38);
          Element::DirtyStackingContext
                    ((this->root)._M_t.
                     super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                     super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                     super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl);
          if (local_38._M_head_impl != (Element *)0x0) {
            (*((local_38._M_head_impl)->super_ScriptInterface).super_Releasable._vptr_Releasable[2])
                      ();
          }
        }
        lVar7 = lVar7 + 1;
        iVar4 = Element::GetNumChildren
                          ((this->root)._M_t.
                           super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                           super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                           super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,false);
        lVar6 = lVar6 + 8;
      } while (lVar7 < iVar4);
    }
  }
  return;
}

Assistant:

void Context::PullDocumentToFront(ElementDocument* document)
{
	if (document != root->GetLastChild())
	{
		// Calling RemoveChild() / AppendChild() would be cleaner, but that dirties the document's layout
		// unnecessarily, so we'll go under the hood here.
		for (int i = 0; i < root->GetNumChildren(); ++i)
		{
			if (root->GetChild(i) == document)
			{
				ElementPtr element = std::move(root->children[i]);
				root->children.erase(root->children.begin() + i);
				root->children.insert(root->children.begin() + root->GetNumChildren(), std::move(element));

				root->DirtyStackingContext();
			}
		}
	}
}